

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void zeroPage(MemPage *pPage,int flags)

{
  byte bVar1;
  u8 *puVar2;
  BtShared *pBVar3;
  ushort uVar4;
  short sVar5;
  u16 first;
  u8 hdr;
  BtShared *pBt;
  uchar *data;
  int flags_local;
  MemPage *pPage_local;
  
  puVar2 = pPage->aData;
  pBVar3 = pPage->pBt;
  bVar1 = pPage->hdrOffset;
  if ((pBVar3->btsFlags & 0xc) != 0) {
    memset(puVar2 + bVar1,0,(ulong)(pBVar3->usableSize - (uint)bVar1));
  }
  puVar2[bVar1] = (u8)flags;
  sVar5 = 8;
  if ((flags & 8U) == 0) {
    sVar5 = 0xc;
  }
  uVar4 = (ushort)bVar1 + sVar5;
  memset(puVar2 + (int)(bVar1 + 1),0,4);
  puVar2[(int)(bVar1 + 7)] = '\0';
  puVar2[(int)(bVar1 + 5)] = (u8)(pBVar3->usableSize >> 8);
  puVar2[(long)(int)(bVar1 + 5) + 1] = (u8)pBVar3->usableSize;
  pPage->nFree = pBVar3->usableSize - (uint)uVar4 & 0xffff;
  decodeFlags(pPage,flags);
  pPage->cellOffset = uVar4;
  pPage->aDataEnd = puVar2 + pBVar3->pageSize;
  pPage->aCellIdx = puVar2 + uVar4;
  pPage->aDataOfst = puVar2 + pPage->childPtrSize;
  pPage->nOverflow = '\0';
  pPage->maskPage = (short)pBVar3->pageSize - 1;
  pPage->nCell = 0;
  pPage->isInit = '\x01';
  return;
}

Assistant:

static void zeroPage(MemPage *pPage, int flags){
  unsigned char *data = pPage->aData;
  BtShared *pBt = pPage->pBt;
  u8 hdr = pPage->hdrOffset;
  u16 first;

  assert( sqlite3PagerPagenumber(pPage->pDbPage)==pPage->pgno || CORRUPT_DB );
  assert( sqlite3PagerGetExtra(pPage->pDbPage) == (void*)pPage );
  assert( sqlite3PagerGetData(pPage->pDbPage) == data );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[hdr], 0, pBt->usableSize - hdr);
  }
  data[hdr] = (char)flags;
  first = hdr + ((flags&PTF_LEAF)==0 ? 12 : 8);
  memset(&data[hdr+1], 0, 4);
  data[hdr+7] = 0;
  put2byte(&data[hdr+5], pBt->usableSize);
  pPage->nFree = (u16)(pBt->usableSize - first);
  decodeFlags(pPage, flags);
  pPage->cellOffset = first;
  pPage->aDataEnd = &data[pBt->pageSize];
  pPage->aCellIdx = &data[first];
  pPage->aDataOfst = &data[pPage->childPtrSize];
  pPage->nOverflow = 0;
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nCell = 0;
  pPage->isInit = 1;
}